

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC_SHA2_256.c
# Opt level: O2

void Hacl_Impl_SHA2_256_update_last(uint32_t *state,uint8_t *data,uint32_t len)

{
  uint8_t *data_00;
  ulong uVar1;
  ulong __n;
  uint8_t blocks [128];
  
  blocks[0x70] = '\0';
  blocks[0x71] = '\0';
  blocks[0x72] = '\0';
  blocks[0x73] = '\0';
  blocks[0x74] = '\0';
  blocks[0x75] = '\0';
  blocks[0x76] = '\0';
  blocks[0x77] = '\0';
  blocks[0x78] = '\0';
  blocks[0x79] = '\0';
  blocks[0x7a] = '\0';
  blocks[0x7b] = '\0';
  blocks[0x7c] = '\0';
  blocks[0x7d] = '\0';
  blocks[0x7e] = '\0';
  blocks[0x7f] = '\0';
  blocks[0x60] = '\0';
  blocks[0x61] = '\0';
  blocks[0x62] = '\0';
  blocks[99] = '\0';
  blocks[100] = '\0';
  blocks[0x65] = '\0';
  blocks[0x66] = '\0';
  blocks[0x67] = '\0';
  blocks[0x68] = '\0';
  blocks[0x69] = '\0';
  blocks[0x6a] = '\0';
  blocks[0x6b] = '\0';
  blocks[0x6c] = '\0';
  blocks[0x6d] = '\0';
  blocks[0x6e] = '\0';
  blocks[0x6f] = '\0';
  blocks[0x50] = '\0';
  blocks[0x51] = '\0';
  blocks[0x52] = '\0';
  blocks[0x53] = '\0';
  blocks[0x54] = '\0';
  blocks[0x55] = '\0';
  blocks[0x56] = '\0';
  blocks[0x57] = '\0';
  blocks[0x58] = '\0';
  blocks[0x59] = '\0';
  blocks[0x5a] = '\0';
  blocks[0x5b] = '\0';
  blocks[0x5c] = '\0';
  blocks[0x5d] = '\0';
  blocks[0x5e] = '\0';
  blocks[0x5f] = '\0';
  blocks[0x40] = '\0';
  blocks[0x41] = '\0';
  blocks[0x42] = '\0';
  blocks[0x43] = '\0';
  blocks[0x44] = '\0';
  blocks[0x45] = '\0';
  blocks[0x46] = '\0';
  blocks[0x47] = '\0';
  blocks[0x48] = '\0';
  blocks[0x49] = '\0';
  blocks[0x4a] = '\0';
  blocks[0x4b] = '\0';
  blocks[0x4c] = '\0';
  blocks[0x4d] = '\0';
  blocks[0x4e] = '\0';
  blocks[0x4f] = '\0';
  blocks[0x30] = '\0';
  blocks[0x31] = '\0';
  blocks[0x32] = '\0';
  blocks[0x33] = '\0';
  blocks[0x34] = '\0';
  blocks[0x35] = '\0';
  blocks[0x36] = '\0';
  blocks[0x37] = '\0';
  blocks[0x38] = '\0';
  blocks[0x39] = '\0';
  blocks[0x3a] = '\0';
  blocks[0x3b] = '\0';
  blocks[0x3c] = '\0';
  blocks[0x3d] = '\0';
  blocks[0x3e] = '\0';
  blocks[0x3f] = '\0';
  blocks[0x20] = '\0';
  blocks[0x21] = '\0';
  blocks[0x22] = '\0';
  blocks[0x23] = '\0';
  blocks[0x24] = '\0';
  blocks[0x25] = '\0';
  blocks[0x26] = '\0';
  blocks[0x27] = '\0';
  blocks[0x28] = '\0';
  blocks[0x29] = '\0';
  blocks[0x2a] = '\0';
  blocks[0x2b] = '\0';
  blocks[0x2c] = '\0';
  blocks[0x2d] = '\0';
  blocks[0x2e] = '\0';
  blocks[0x2f] = '\0';
  blocks[0x10] = '\0';
  blocks[0x11] = '\0';
  blocks[0x12] = '\0';
  blocks[0x13] = '\0';
  blocks[0x14] = '\0';
  blocks[0x15] = '\0';
  blocks[0x16] = '\0';
  blocks[0x17] = '\0';
  blocks[0x18] = '\0';
  blocks[0x19] = '\0';
  blocks[0x1a] = '\0';
  blocks[0x1b] = '\0';
  blocks[0x1c] = '\0';
  blocks[0x1d] = '\0';
  blocks[0x1e] = '\0';
  blocks[0x1f] = '\0';
  blocks[0] = '\0';
  blocks[1] = '\0';
  blocks[2] = '\0';
  blocks[3] = '\0';
  blocks[4] = '\0';
  blocks[5] = '\0';
  blocks[6] = '\0';
  blocks[7] = '\0';
  blocks[8] = '\0';
  blocks[9] = '\0';
  blocks[10] = '\0';
  blocks[0xb] = '\0';
  blocks[0xc] = '\0';
  blocks[0xd] = '\0';
  blocks[0xe] = '\0';
  blocks[0xf] = '\0';
  data_00 = blocks + (ulong)(len < 0x38) * 0x40;
  __n = (ulong)len;
  memcpy(data_00,data,__n);
  uVar1 = (ulong)state[0x88] * 0x200 + __n * 8;
  data_00[__n] = 0x80;
  *(ulong *)(data_00 + (ulong)(0x37 - len & 0x3f) + 1 + __n) =
       (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
       (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | __n << 0x3b;
  Hacl_Impl_SHA2_256_update_multi(state,data_00,2 - (len < 0x38));
  return;
}

Assistant:

static void Hacl_Impl_SHA2_256_update_last(uint32_t *state, uint8_t *data, uint32_t len)
{
  uint8_t blocks[128U] = { 0U };
  uint32_t nb;
  if (len < (uint32_t)56U)
    nb = (uint32_t)1U;
  else
    nb = (uint32_t)2U;
  uint8_t *final_blocks;
  if (len < (uint32_t)56U)
    final_blocks = blocks + (uint32_t)64U;
  else
    final_blocks = blocks;
  memcpy(final_blocks, data, len * sizeof data[0U]);
  uint32_t n1 = state[136U];
  uint8_t *padding = final_blocks + len;
  uint32_t
  pad0len = ((uint32_t)64U - (len + (uint32_t)8U + (uint32_t)1U) % (uint32_t)64U) % (uint32_t)64U;
  uint8_t *buf1 = padding;
  uint8_t *buf2 = padding + (uint32_t)1U + pad0len;
  uint64_t
  encodedlen = ((uint64_t)n1 * (uint64_t)(uint32_t)64U + (uint64_t)len) * (uint64_t)(uint32_t)8U;
  buf1[0U] = (uint8_t)0x80U;
  store64_be(buf2, encodedlen);
  Hacl_Impl_SHA2_256_update_multi(state, final_blocks, nb);
}